

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O3

string * __thiscall
choc::text::CodePrinter::toString_abi_cxx11_(string *__return_storage_ptr__,CodePrinter *this)

{
  byte bVar1;
  pointer pLVar2;
  const_iterator __begin2;
  const_iterator __end2;
  size_type len;
  size_type sVar3;
  Line *l_1;
  pointer pLVar4;
  vector<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_> *__range2;
  size_type len_1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (pLVar4 = (this->lines).
                super__Vector_base<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (this->lines).
      super__Vector_base<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar4; pLVar4 = pLVar4 + 1) {
    sVar3 = (pLVar4->line)._M_string_length;
    if (sVar3 != 0) {
      do {
        bVar1 = (pLVar4->line)._M_dataplus._M_p[sVar3 - 1];
        if ((4 < bVar1 - 9) && (bVar1 != 0x20)) break;
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
  }
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pLVar4 = (this->lines).
           super__Vector_base<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->lines).
           super__Vector_base<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pLVar4 == pLVar2) {
      return __return_storage_ptr__;
    }
    sVar3 = (pLVar4->line)._M_string_length;
    if (sVar3 != 0) {
      do {
        bVar1 = (pLVar4->line)._M_dataplus._M_p[sVar3 - 1];
        if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
          std::__cxx11::string::_M_replace_aux
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                     (char)pLVar4->indent);
          std::__cxx11::string::replace
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,
                     (char *)0x0,(ulong)(pLVar4->line)._M_dataplus._M_p);
          break;
        }
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(this->newLineString)._M_dataplus._M_p);
    pLVar4 = pLVar4 + 1;
  } while( true );
}

Assistant:

inline std::string CodePrinter::toString() const
{
    std::string s;
    auto totalLen = lines.size() * newLineString.length() + 1;

    for (auto& l : lines)
        if (auto contentLen = getLengthWithTrimmedEnd (l.line))
            totalLen += l.indent + contentLen;

    s.reserve (totalLen);

    for (auto& l : lines)
    {
        if (auto contentLen = getLengthWithTrimmedEnd (l.line))
        {
            s.append (l.indent, ' ');
            s.append (l.line.begin(), l.line.begin() + static_cast<std::string::difference_type> (contentLen));
        }

        s.append (newLineString);
    }

    return s;
}